

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O3

void __thiscall slack::_detail::Element::Element(Element *this,string *l,string *v)

{
  pointer pcVar1;
  
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  pcVar1 = (l->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + l->_M_string_length);
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  pcVar1 = (v->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value,pcVar1,pcVar1 + v->_M_string_length);
  return;
}

Assistant:

Element(const std::string& l, const std::string& v) : label(l), value(v) {}